

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O3

void __thiscall
CoreML::LinearModel::LinearModel(LinearModel *this,string *predictedValueOutput,string *description)

{
  element_type *peVar1;
  ulong uVar2;
  ModelDescription *pMVar3;
  undefined8 *puVar4;
  Arena *arena;
  
  Model::Model(&this->super_Model,description);
  (this->super_Model)._vptr_Model = (_func_int **)&PTR__Model_0048fc08;
  peVar1 = (this->super_Model).m_spec.
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pMVar3 = peVar1->description_;
  if (pMVar3 == (ModelDescription *)0x0) {
    uVar2 = (peVar1->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pMVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (arena);
    peVar1->description_ = pMVar3;
  }
  uVar2 = (pMVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar4 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar4 = (undefined8 *)*puVar4;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&pMVar3->predictedfeaturename_,predictedValueOutput,puVar4);
  return;
}

Assistant:

LinearModel::LinearModel(const std::string& predictedValueOutput,
                             const std::string& description)
    : Model(description) {
        m_spec->mutable_description()->set_predictedfeaturename(predictedValueOutput);
    }